

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O0

Node * __thiscall
Parser::createFunctionParametersListNode
          (Parser *this,Token *t,vector<Token_*,_std::allocator<Token_*>_> *params_tokens,
          vector<Node_*,_std::allocator<Node_*>_> *params,
          vector<Node_*,_std::allocator<Node_*>_> *default_values)

{
  Node *pNVar1;
  size_type sVar2;
  Node *this_00;
  reference ppNVar3;
  vector<Node_*,_std::allocator<Node_*>_> *in_RCX;
  vector<Token_*,_std::allocator<Token_*>_> *in_RDX;
  vector<Node_*,_std::allocator<Node_*>_> *in_R8;
  Node *param;
  size_t i;
  Node *n;
  Token *in_stack_ffffffffffffff70;
  CompilationContext *in_stack_ffffffffffffff78;
  Node *in_stack_ffffffffffffff80;
  Node *this_01;
  ulong local_48;
  
  pNVar1 = (Node *)operator_new(0x30);
  Node::Node(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  pNVar1->nodeType = PNT_FUNCTION_PARAMETERS_LIST;
  local_48 = 0;
  while( true ) {
    sVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::size(in_RCX);
    if (sVar2 <= local_48) break;
    this_00 = (Node *)operator_new(0x30);
    std::vector<Token_*,_std::allocator<Token_*>_>::operator[](in_RDX,local_48);
    Node::Node(this_00,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    this_00->nodeType = PNT_FUNCTION_PARAMETER;
    in_stack_ffffffffffffff78 = (CompilationContext *)&this_00->children;
    this_01 = this_00;
    std::vector<Node_*,_std::allocator<Node_*>_>::operator[](in_RCX,local_48);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)this_01,
               (value_type *)in_stack_ffffffffffffff78);
    ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](in_R8,local_48);
    if (*ppNVar3 != (value_type)0x0) {
      in_stack_ffffffffffffff70 = (Token *)&this_00->children;
      std::vector<Node_*,_std::allocator<Node_*>_>::operator[](in_R8,local_48);
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                ((vector<Node_*,_std::allocator<Node_*>_> *)this_01,
                 (value_type *)in_stack_ffffffffffffff78);
    }
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
              ((vector<Node_*,_std::allocator<Node_*>_> *)this_01,
               (value_type *)in_stack_ffffffffffffff78);
    local_48 = local_48 + 1;
  }
  return pNVar1;
}

Assistant:

Node * createFunctionParametersListNode(Token & t, vector<Token *> & params_tokens,
    vector<Node *> & params, vector<Node *> & default_values)
  {
    Node * n = new Node(ctx, t);
    n->nodeType = PNT_FUNCTION_PARAMETERS_LIST;

    for (size_t i = 0; i < params.size(); i++)
    {
      Node * param = new Node(ctx, *params_tokens[i]);
      param->nodeType = PNT_FUNCTION_PARAMETER;
      param->children.push_back(params[i]);
      if (default_values[i])
        param->children.push_back(default_values[i]);
      n->children.push_back(param);
    }

    return n;
  }